

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

int clamp(int value,int prec,int sgnd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if (sgnd == 0) {
    if (prec < 9) {
      iVar3 = 0xff;
    }
    else {
      if (0x10 < (uint)prec) {
        return value;
      }
      iVar3 = 0xffff;
    }
    if (value < iVar3) {
      iVar3 = value;
    }
    iVar2 = 0;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    return iVar2;
  }
  if (prec < 9) {
    iVar3 = 0x7f;
    if (value < 0x7f) {
      iVar3 = value;
    }
    bVar4 = SBORROW4(iVar3,-0x7f);
    iVar2 = iVar3 + 0x7f;
    iVar1 = -0x80;
  }
  else {
    if (0x10 < (uint)prec) {
      return value;
    }
    iVar3 = 0x7fff;
    if (value < 0x7fff) {
      iVar3 = value;
    }
    bVar4 = SBORROW4(iVar3,-0x7fff);
    iVar2 = iVar3 + 0x7fff;
    iVar1 = -0x8000;
  }
  if (bVar4 == iVar2 < 0) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

static INLINE int clamp(const int value, const int prec, const int sgnd)
{
    if (sgnd) {
        if (prec <= 8) {
            return CLAMP(value, -128, 127);
        } else if (prec <= 16) {
            return CLAMP(value, -32768, 32767);
        } else {
            return CLAMP(value, -2147483647 - 1, 2147483647);
        }
    } else {
        if (prec <= 8) {
            return CLAMP(value, 0, 255);
        } else if (prec <= 16) {
            return CLAMP(value, 0, 65535);
        } else {
            return value;    /*CLAMP(value,0,4294967295);*/
        }
    }
}